

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O3

void __thiscall
cornerstone::raft_server::handle_install_snapshot_resp(raft_server *this,resp_msg *resp)

{
  mutex *__mutex;
  peer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  iterator iVar6;
  size_t sVar7;
  undefined4 extraout_var;
  bool bVar8;
  bool bVar9;
  ptr<snapshot> nil_snp;
  long *local_d0 [2];
  long local_c0 [2];
  pthread_mutex_t *local_b0;
  ptr<snapshot> local_a8;
  element_type local_98 [2];
  char *local_40;
  
  std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base);
  local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,(resp->super_msg_base).src_);
  iVar6 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_a8);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40 = "the response is from an unkonw peer %d";
    snprintf((char *)&local_a8,100,"the response is from an unkonw peer %d",
             (ulong)(uint)(resp->super_msg_base).src_);
    local_d0[0] = local_c0;
    sVar7 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,&local_a8,
               (long)&local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + sVar7);
    (*peVar2->_vptr_logger[3])(peVar2,local_d0);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
  }
  else {
    this_00 = *(peer **)((long)iVar6.
                               super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                               ._M_cur + 0x10);
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                      ._M_cur + 0x18);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    if (resp->accepted_ == true) {
      __mutex = &this_00->lock_;
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      peVar1 = (this_00->snp_sync_ctx_).
               super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      this_02 = (this_00->snp_sync_ctx_).
                super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      local_b0 = (pthread_mutex_t *)__mutex;
      if (peVar1 == (element_type *)0x0) {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"no snapshot sync context for this peer, drop the response",
                   "");
        (*peVar2->_vptr_logger[3])(peVar2,&local_a8);
        if (local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            local_98) {
          operator_delete(local_a8.
                          super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,local_98[0].last_log_idx_ + 1);
        }
        bVar8 = true;
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (resp->next_idx_ <
            ((peVar1->snapshot_).
             super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size_) {
          local_40 = "continue to sync snapshot at offset %llu";
          snprintf((char *)&local_a8,100,"continue to sync snapshot at offset %llu");
          local_d0[0] = local_c0;
          sVar7 = strlen((char *)&local_a8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,&local_a8,
                     (long)&local_a8.
                            super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + sVar7);
          (*peVar2->_vptr_logger[2])(peVar2,local_d0);
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          peVar1->offset_ = resp->next_idx_;
          bVar8 = false;
        }
        else {
          local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"snapshot sync is done","");
          (*peVar2->_vptr_logger[2])(peVar2,&local_a8);
          if (local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != local_98) {
            operator_delete(local_a8.
                            super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,local_98[0].last_log_idx_ + 1);
          }
          local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          uVar3 = ((peVar1->snapshot_).
                   super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  last_log_idx_;
          this_00->next_log_idx_ = uVar3 + 1;
          this_00->matched_idx_ = uVar3;
          peer::set_snapshot_in_sync(this_00,&local_a8);
          bVar8 = false;
          LOCK();
          bVar9 = (this_00->pending_commit_flag_)._M_base._M_i == true;
          if (bVar9) {
            (this_00->pending_commit_flag_)._M_base._M_i = false;
          }
          UNLOCK();
          if (!bVar9) {
            uVar4 = resp->next_idx_;
            iVar5 = (*((this->log_store_).
                       super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->_vptr_log_store[2])();
            bVar8 = CONCAT44(extraout_var,iVar5) <= uVar4;
          }
          if (local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.
                       super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      pthread_mutex_unlock(local_b0);
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"peer declines to install the snapshot, will retry","");
      (*peVar2->_vptr_logger[3])(peVar2,&local_a8);
      if (local_a8.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          local_98) {
        operator_delete(local_a8.
                        super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,local_98[0].last_log_idx_ + 1);
      }
      bVar8 = false;
    }
    if ((!bVar8) && (this->role_ == leader)) {
      request_append_entries(this,this_00);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp(resp_msg& resp)
{
    read_lock(peers_lock_);
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end())
    {
        l_->info(sstrfmt("the response is from an unkonw peer %d").fmt(resp.get_src()));
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced, continue to send appendEntries to
    // this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted())
    {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ptr<snapshot_sync_ctx> sync_ctx = p->get_snapshot_sync_ctx();
        if (sync_ctx == nilptr)
        {
            l_->info("no snapshot sync context for this peer, drop the response");
            need_to_catchup = false;
        }
        else
        {
            if (resp.get_next_idx() >= sync_ctx->get_snapshot()->size())
            {
                l_->debug("snapshot sync is done");
                ptr<snapshot> nil_snp;
                p->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                p->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
                p->set_snapshot_in_sync(nil_snp);
                need_to_catchup = p->clear_pending_commit() || resp.get_next_idx() < log_store_->next_slot();
            }
            else
            {
                l_->debug(sstrfmt("continue to sync snapshot at offset %llu").fmt(resp.get_next_idx()));
                sync_ctx->set_offset(resp.get_next_idx());
            }
        }
    }
    else
    {
        l_->info("peer declines to install the snapshot, will retry");
    }

    // This may not be a leader anymore, such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup)
    {
        request_append_entries(*p);
    }
}